

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# busyindicator.cpp
# Opt level: O0

void __thiscall
QtMWidgets::BusyIndicatorPrivate::BusyIndicatorPrivate
          (BusyIndicatorPrivate *this,BusyIndicator *parent)

{
  BusyIndicator *parent_local;
  BusyIndicatorPrivate *this_local;
  
  this->q = parent;
  this->outerRadius = 10;
  this->innerRadius = (int)((double)this->outerRadius * 0.6);
  QSize::QSize(&this->size,this->outerRadius << 1,this->outerRadius << 1);
  this->running = true;
  this->animation = (QVariantAnimation *)0x0;
  QColor::QColor(&this->color);
  return;
}

Assistant:

BusyIndicatorPrivate( BusyIndicator * parent )
		:	q( parent )
		,	outerRadius( 10 )
		,	innerRadius( outerRadius * 0.6 )
		,	size( outerRadius * 2, outerRadius * 2 )
		,	running( true )
		,	animation( 0 )
	{
	}